

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem2.h
# Opt level: O0

word * Mmr_FixedEntry(Mmr_Fixed_t *p,int h)

{
  int iVar1;
  void *pvVar2;
  int h_local;
  Mmr_Fixed_t *p_local;
  
  if (0 < h) {
    iVar1 = Vec_PtrSize(&p->vPages);
    if (h < iVar1 << ((byte)p->nPageBase & 0x1f)) {
      pvVar2 = Vec_PtrEntry(&p->vPages,h >> ((byte)p->nPageBase & 0x1f));
      return (word *)((long)pvVar2 + (long)(h & p->PageMask) * 8);
    }
  }
  __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
}

Assistant:

static inline word * Mmr_FixedEntry( Mmr_Fixed_t * p, int h )
{
    assert( h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase) );
    return (word *)Vec_PtrEntry(&p->vPages, (h >> p->nPageBase)) + (h & p->PageMask);
}